

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void __thiscall czh::parser::Parser::parse_id(Parser *this)

{
  Value *_value;
  Token *this_00;
  TokenType TVar1;
  bool bVar2;
  Node *pNVar3;
  _Alloc_hider _Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id_name;
  Token bak;
  undefined1 local_2d0 [72];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_288;
  Reference local_280;
  string local_268;
  string local_248;
  source_location local_228;
  string local_220;
  string local_200;
  string local_1e0;
  undefined1 local_1c0 [16];
  __impl local_1b0;
  size_t local_190;
  size_t sStack_188;
  element_type *local_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_178;
  Token local_170;
  Token local_120;
  Token local_d0;
  Token local_80;
  
  if (this->lex->is_eof != false) {
    return;
  }
  _value = &(this->curr_tok).what;
  local_1c0._0_8_ = &PTR_s__workspace_llm4binary_github_lic_0019f3a8;
  value::Value::
  internal_get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            (&local_268,_value,local_1c0);
  local_1c0._0_8_ = &PTR_s__workspace_llm4binary_github_lic_0019f3c0;
  bVar2 = node::Node::has_node(this->curr_node,&local_268,(source_location *)local_1c0);
  this_00 = &this->curr_tok;
  if (bVar2) {
    local_1c0._0_8_ = &local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"Duplicate node name.","");
    token::Token::report_error(this_00,(string *)local_1c0);
    if ((__impl *)local_1c0._0_8_ != &local_1b0) {
      operator_delete((void *)local_1c0._0_8_,(ulong)((long)local_1b0._M_file_name + 1));
    }
  }
  token::Token::Token((Token *)local_1c0,this_00);
  lexer::Lexer::get((Token *)local_2d0,this->lex);
  token::Token::operator=(this_00,(Token *)local_2d0);
  if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)(local_2d0 + 8));
  if (this_00->type == COLON) {
    lexer::Lexer::get((Token *)local_2d0,this->lex);
    token::Token::operator=(this_00,(Token *)local_2d0);
    if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
    }
    std::__detail::__variant::
    _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)(local_2d0 + 8));
    pNVar3 = this->curr_node;
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,local_268._M_dataplus._M_p,
               local_268._M_dataplus._M_p + local_268._M_string_length);
    local_2d0._0_8_ = local_2d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"");
    local_80.type = local_1c0._0_4_;
    std::__detail::__variant::
    _Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&local_80.what,
                      (_Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)(local_1c0 + 8));
    local_80.pos.pos = local_190;
    local_80.pos.size = sStack_188;
    local_80.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_180;
    local_80.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_178._M_pi;
    local_180 = (element_type *)0x0;
    _Stack_178._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_280.path.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR_s__workspace_llm4binary_github_lic_0019f3d8;
    pNVar3 = node::Node::add_node
                       (pNVar3,&local_1e0,(string *)local_2d0,&local_80,
                        (source_location *)&local_280);
    this->curr_node = pNVar3;
    if (local_80.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::__detail::__variant::
    _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&local_80.what);
    if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
      operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
    }
    local_220.field_2._M_allocated_capacity = local_1e0.field_2._M_allocated_capacity;
    _Var4._M_p = local_1e0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p == &local_1e0.field_2) goto LAB_0011a70d;
  }
  else {
    lexer::Lexer::get((Token *)local_2d0,this->lex);
    token::Token::operator=(this_00,(Token *)local_2d0);
    if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
    }
    std::__detail::__variant::
    _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)(local_2d0 + 8));
    TVar1 = this_00->type;
    if (TVar1 != REF) {
      if (TVar1 == ARR_LP) {
        pNVar3 = this->curr_node;
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_220,local_268._M_dataplus._M_p,
                   local_268._M_dataplus._M_p + local_268._M_string_length);
        parse_array_abi_cxx11_((Array *)&local_280,this);
        local_2d0._0_8_ = local_2d0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"");
        local_120.type = local_1c0._0_4_;
        std::__detail::__variant::
        _Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::_Move_ctor_base((_Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&local_120.what,
                          (_Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)(local_1c0 + 8));
        local_120.pos.pos = local_190;
        local_120.pos.size = sStack_188;
        local_120.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_180;
        local_120.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Stack_178._M_pi;
        local_180 = (element_type *)0x0;
        _Stack_178._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_228._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_0019f408;
        node::Node::
        add<std::vector<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>,std::allocator<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>>>,void>
                  (pNVar3,&local_220,
                   (vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_280,(string *)local_2d0,&local_120,&local_228);
        if (local_120.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_120.pos.code.
                     super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        std::__detail::__variant::
        _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&local_120.what);
        if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
          operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
        }
        std::
        vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_280);
        _Var4._M_p = local_220._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p == &local_220.field_2) goto LAB_0011a70d;
        goto LAB_0011a705;
      }
      if (TVar1 != ID) {
        pNVar3 = this->curr_node;
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_248,local_268._M_dataplus._M_p,
                   local_268._M_dataplus._M_p + local_268._M_string_length);
        local_2d0._0_8_ = local_2d0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"");
        local_170.type = local_1c0._0_4_;
        std::__detail::__variant::
        _Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::_Move_ctor_base((_Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&local_170.what,
                          (_Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)(local_1c0 + 8));
        local_170.pos.pos = local_190;
        local_170.pos.size = sStack_188;
        local_170.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_180;
        local_170.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Stack_178._M_pi;
        local_180 = (element_type *)0x0;
        _Stack_178._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_280.path.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&PTR_s__workspace_llm4binary_github_lic_0019f420;
        node::Node::add<czh::value::Value&,void>
                  (pNVar3,&local_248,_value,(string *)local_2d0,&local_170,
                   (source_location *)&local_280);
        if (local_170.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_170.pos.code.
                     super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        std::__detail::__variant::
        _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&local_170.what);
        if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
          operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        lexer::Lexer::get((Token *)local_2d0,this->lex);
        token::Token::operator=(this_00,(Token *)local_2d0);
        if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
        }
        std::__detail::__variant::
        _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)(local_2d0 + 8));
        goto LAB_0011a70d;
      }
    }
    pNVar3 = this->curr_node;
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_200,local_268._M_dataplus._M_p,
               local_268._M_dataplus._M_p + local_268._M_string_length);
    parse_ref(&local_280,this);
    local_2d0._0_8_ = local_2d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"");
    local_d0.type = local_1c0._0_4_;
    std::__detail::__variant::
    _Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&local_d0.what,
                      (_Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)(local_1c0 + 8));
    local_d0.pos.pos = local_190;
    local_d0.pos.size = sStack_188;
    local_d0.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_180;
    local_d0.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_178._M_pi;
    local_180 = (element_type *)0x0;
    _Stack_178._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_0019f3f0;
    node::Node::add<czh::value::Reference,void>
              (pNVar3,&local_200,&local_280,(string *)local_2d0,&local_d0,&local_228);
    if (local_d0.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d0.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::__detail::__variant::
    _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&local_d0.what);
    if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
      operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_280.path);
    local_220.field_2._M_allocated_capacity = local_200.field_2._M_allocated_capacity;
    _Var4._M_p = local_200._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p == &local_200.field_2) goto LAB_0011a70d;
  }
LAB_0011a705:
  operator_delete(_Var4._M_p,local_220.field_2._M_allocated_capacity + 1);
LAB_0011a70d:
  if (_Stack_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_178._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)(local_1c0 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

bool check()
    {
      return !lex->eof();
    }